

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxerutil.cc
# Opt level: O0

bool mkvmuxer::WriteEbmlDateElement(IMkvWriter *writer,uint64 type,int64 value)

{
  int32 iVar1;
  uint64 in_RDX;
  IMkvWriter *in_RSI;
  uint64 in_RDI;
  undefined7 in_stack_fffffffffffffff8;
  undefined1 in_stack_ffffffffffffffff;
  bool bVar2;
  
  if (in_RDI == 0) {
    bVar2 = false;
  }
  else {
    iVar1 = WriteID((IMkvWriter *)CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8),
                    in_RDI);
    if (iVar1 == 0) {
      iVar1 = WriteUInt(in_RSI,in_RDX);
      if (iVar1 == 0) {
        iVar1 = SerializeInt((IMkvWriter *)
                             CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8),in_RDI,
                             (int32)((ulong)in_RSI >> 0x20));
        if (iVar1 == 0) {
          bVar2 = true;
        }
        else {
          bVar2 = false;
        }
      }
      else {
        bVar2 = false;
      }
    }
    else {
      bVar2 = false;
    }
  }
  return bVar2;
}

Assistant:

bool WriteEbmlDateElement(IMkvWriter* writer, uint64 type, int64 value) {
  if (!writer)
    return false;

  if (WriteID(writer, type))
    return false;

  if (WriteUInt(writer, kDateElementSize))
    return false;

  if (SerializeInt(writer, value, kDateElementSize))
    return false;

  return true;
}